

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O2

void __thiscall ki::dml::value_error::value_error(value_error *this,string *message)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)message);
  runtime_error::runtime_error(&this->super_runtime_error,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)&this->super_runtime_error = &PTR__runtime_error_0015ed08;
  return;
}

Assistant:

value_error(std::string message) : runtime_error(message) { }